

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint unfilter(uchar *out,uchar *in,uint w,uint h,uint bpp)

{
  long lVar1;
  byte bVar2;
  uchar uVar3;
  uchar uVar4;
  uchar uVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  bool bVar9;
  byte bVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  byte bVar14;
  uint uVar15;
  ulong uVar16;
  uchar *puVar17;
  uint uVar18;
  uint uVar19;
  long lVar21;
  ulong uVar22;
  uchar *puVar23;
  long lVar24;
  ulong uVar25;
  byte bVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  byte bVar30;
  byte bVar31;
  byte bVar32;
  uint uVar33;
  uchar *puVar34;
  uchar *local_b8;
  uchar *local_a8;
  ulong uVar20;
  
  if (h == 0) {
    return 0;
  }
  uVar33 = bpp + 7;
  uVar8 = uVar33 >> 3;
  uVar6 = (ulong)uVar8;
  uVar15 = w * bpp + 7;
  uVar18 = uVar15 >> 3;
  uVar20 = (ulong)uVar18;
  lVar1 = uVar20 + 1;
  puVar23 = in + 1;
  lVar11 = -uVar6;
  lVar24 = (long)out - uVar6;
  lVar7 = -uVar6;
  lVar21 = uVar20 - uVar6;
  local_b8 = out + uVar6;
  local_a8 = in + uVar6 + 1;
  uVar16 = 0;
  puVar34 = (uchar *)0x0;
  puVar17 = out;
  do {
    switch(in[lVar1 * uVar16]) {
    case '\0':
      if (7 < uVar15) {
        uVar13 = 0;
        do {
          puVar17[uVar13] = puVar23[uVar13];
          uVar13 = uVar13 + 1;
        } while (uVar20 != uVar13);
      }
LAB_00119e9b:
      uVar19 = 0;
      bVar9 = true;
      break;
    case '\x01':
      if (7 < uVar33) {
        uVar13 = 0;
        do {
          puVar17[uVar13] = puVar23[uVar13];
          uVar13 = uVar13 + 1;
        } while (uVar6 != uVar13);
      }
      uVar19 = 0;
      bVar9 = true;
      if (uVar18 <= uVar8) goto LAB_00119e9b;
      lVar12 = 0;
      do {
        local_b8[lVar12] = puVar17[lVar12] + local_a8[lVar12];
        lVar12 = lVar12 + 1;
      } while (lVar21 != lVar12);
      break;
    case '\x02':
      uVar19 = 0;
      bVar9 = true;
      if (puVar34 == (uchar *)0x0) {
        uVar19 = 0;
        if (7 < uVar15) {
          uVar13 = 0;
          do {
            puVar17[uVar13] = puVar23[uVar13];
            uVar13 = uVar13 + 1;
          } while (uVar20 != uVar13);
          goto LAB_00119e9b;
        }
      }
      else if (7 < uVar15) {
        uVar13 = 0;
        do {
          puVar17[uVar13] = puVar34[uVar13] + puVar23[uVar13];
          uVar13 = uVar13 + 1;
        } while (uVar20 != uVar13);
      }
      break;
    case '\x03':
      if (puVar34 == (uchar *)0x0) {
        if (7 < uVar33) {
          uVar13 = 0;
          do {
            puVar17[uVar13] = puVar23[uVar13];
            uVar13 = uVar13 + 1;
          } while (uVar6 != uVar13);
        }
        if (uVar18 <= uVar8) goto LAB_00119e9b;
        lVar12 = 0;
        do {
          local_b8[lVar12] = (puVar17[lVar12] >> 1) + local_a8[lVar12];
          lVar12 = lVar12 + 1;
          uVar19 = 0;
          bVar9 = true;
        } while (lVar21 != lVar12);
      }
      else {
        if (7 < uVar33) {
          uVar13 = 0;
          do {
            puVar17[uVar13] = (puVar34[uVar13] >> 1) + puVar23[uVar13];
            uVar13 = uVar13 + 1;
          } while (uVar6 != uVar13);
        }
        bVar9 = true;
        uVar19 = 0;
        if (uVar8 < uVar18) {
          lVar12 = 0;
          do {
            local_b8[lVar12] =
                 (char)((uint)puVar34[lVar12 + uVar6] + (uint)puVar17[lVar12] >> 1) +
                 local_a8[lVar12];
            lVar12 = lVar12 + 1;
            bVar9 = true;
          } while (lVar21 != lVar12);
        }
      }
      break;
    case '\x04':
      if (puVar34 == (uchar *)0x0) {
        if (7 < uVar33) {
          uVar13 = 0;
          do {
            puVar17[uVar13] = puVar23[uVar13];
            uVar13 = uVar13 + 1;
          } while (uVar6 != uVar13);
        }
        if (uVar18 <= uVar8) goto LAB_00119e9b;
        lVar12 = 0;
        do {
          local_b8[lVar12] = puVar17[lVar12] + local_a8[lVar12];
          lVar12 = lVar12 + 1;
          uVar19 = 0;
          bVar9 = true;
        } while (lVar21 != lVar12);
      }
      else {
        if (uVar33 < 8) {
          uVar22 = 0;
        }
        else {
          uVar13 = 0;
          do {
            puVar17[uVar13] = puVar34[uVar13] + puVar23[uVar13];
            uVar13 = uVar13 + 1;
            uVar22 = uVar6;
          } while (uVar6 != uVar13);
        }
        if (uVar33 < 0x20) {
          if (uVar8 == 3) {
            uVar13 = uVar22;
            if ((int)uVar22 + 2U < uVar18) {
              do {
                bVar30 = *(byte *)(lVar24 + uVar13);
                bVar32 = *(byte *)(lVar24 + 1 + uVar13);
                bVar31 = puVar34[uVar13];
                bVar26 = puVar34[uVar13 + 1];
                bVar10 = puVar34[uVar13 + lVar7];
                uVar27 = (uint)bVar31 - (uint)bVar10;
                uVar19 = -uVar27;
                if (0 < (int)uVar27) {
                  uVar19 = uVar27;
                }
                uVar19 = uVar19 & 0xff;
                uVar28 = (uint)bVar30 - (uint)bVar10;
                uVar27 = -uVar28;
                if (0 < (int)uVar28) {
                  uVar27 = uVar28;
                }
                uVar29 = (uint)bVar31 + (uint)bVar30 + (uint)bVar10 * -2;
                uVar28 = -uVar29;
                if (0 < (int)uVar29) {
                  uVar28 = uVar29;
                }
                bVar14 = puVar34[uVar13 + 2];
                if ((uVar27 & 0xff) < uVar19) {
                  bVar30 = bVar31;
                  uVar19 = uVar27 & 0xff;
                }
                bVar31 = puVar34[uVar13 + lVar7 + 1];
                if (uVar28 < uVar19) {
                  bVar30 = bVar10;
                }
                uVar27 = (uint)bVar26 - (uint)bVar31;
                uVar19 = -uVar27;
                if (0 < (int)uVar27) {
                  uVar19 = uVar27;
                }
                uVar19 = uVar19 & 0xff;
                uVar28 = (uint)bVar32 - (uint)bVar31;
                uVar27 = -uVar28;
                if (0 < (int)uVar28) {
                  uVar27 = uVar28;
                }
                uVar29 = (uint)bVar26 + (uint)bVar32 + (uint)bVar31 * -2;
                uVar28 = -uVar29;
                if (0 < (int)uVar29) {
                  uVar28 = uVar29;
                }
                if ((uVar27 & 0xff) < uVar19) {
                  bVar32 = bVar26;
                  uVar19 = uVar27 & 0xff;
                }
                bVar26 = puVar34[uVar13 + lVar7 + 2];
                if (uVar28 < uVar19) {
                  bVar32 = bVar31;
                }
                uVar3 = puVar23[uVar13 + 1];
                uVar27 = (uint)bVar14 - (uint)bVar26;
                uVar19 = -uVar27;
                if (0 < (int)uVar27) {
                  uVar19 = uVar27;
                }
                bVar31 = *(byte *)(lVar24 + 2 + uVar13);
                uVar19 = uVar19 & 0xff;
                uVar28 = (uint)bVar31 - (uint)bVar26;
                uVar27 = -uVar28;
                if (0 < (int)uVar28) {
                  uVar27 = uVar28;
                }
                uVar29 = (uint)bVar14 + (uint)bVar31 + (uint)bVar26 * -2;
                uVar28 = -uVar29;
                if (0 < (int)uVar29) {
                  uVar28 = uVar29;
                }
                if ((uVar27 & 0xff) < uVar19) {
                  bVar31 = bVar14;
                  uVar19 = uVar27 & 0xff;
                }
                if (uVar28 < uVar19) {
                  bVar31 = bVar26;
                }
                uVar4 = puVar23[uVar13 + 2];
                puVar17[uVar13] = bVar30 + puVar23[uVar13];
                puVar17[uVar13 + 1] = bVar32 + uVar3;
                puVar17[uVar13 + 2] = bVar31 + uVar4;
                uVar22 = uVar13 + 3;
                uVar25 = uVar13 + 5;
                uVar13 = uVar22;
              } while (uVar25 < uVar20);
            }
          }
          else if ((0xf < uVar33) && (uVar13 = uVar22 + 1, (uint)(uVar22 + 1) < uVar18)) {
            do {
              uVar22 = uVar13;
              bVar30 = *(byte *)(lVar24 + -1 + uVar22);
              bVar32 = puVar34[uVar22 - 1];
              bVar31 = puVar34[uVar22];
              bVar26 = puVar34[uVar22 + lVar11 + -1];
              uVar27 = (uint)bVar32 - (uint)bVar26;
              uVar19 = -uVar27;
              if (0 < (int)uVar27) {
                uVar19 = uVar27;
              }
              uVar19 = uVar19 & 0xff;
              uVar28 = (uint)bVar30 - (uint)bVar26;
              uVar27 = -uVar28;
              if (0 < (int)uVar28) {
                uVar27 = uVar28;
              }
              uVar29 = (uint)bVar32 + (uint)bVar30 + (uint)bVar26 * -2;
              uVar28 = -uVar29;
              if (0 < (int)uVar29) {
                uVar28 = uVar29;
              }
              if ((uVar27 & 0xff) < uVar19) {
                bVar30 = bVar32;
                uVar19 = uVar27 & 0xff;
              }
              bVar32 = puVar34[uVar22 + lVar11];
              if (uVar28 < uVar19) {
                bVar30 = bVar26;
              }
              uVar27 = (uint)bVar31 - (uint)bVar32;
              uVar19 = -uVar27;
              if (0 < (int)uVar27) {
                uVar19 = uVar27;
              }
              bVar26 = *(byte *)(lVar24 + uVar22);
              uVar19 = uVar19 & 0xff;
              uVar28 = (uint)bVar26 - (uint)bVar32;
              uVar27 = -uVar28;
              if (0 < (int)uVar28) {
                uVar27 = uVar28;
              }
              uVar29 = (uint)bVar31 + (uint)bVar26 + (uint)bVar32 * -2;
              uVar28 = -uVar29;
              if (0 < (int)uVar29) {
                uVar28 = uVar29;
              }
              if ((uVar27 & 0xff) < uVar19) {
                bVar26 = bVar31;
                uVar19 = uVar27 & 0xff;
              }
              if (uVar28 < uVar19) {
                bVar26 = bVar32;
              }
              uVar3 = puVar23[uVar22];
              puVar17[uVar22 - 1] = bVar30 + puVar23[uVar22 - 1];
              puVar17[uVar22] = bVar26 + uVar3;
              uVar13 = uVar22 + 2;
            } while (uVar22 + 2 < uVar20);
            goto LAB_0011a3a9;
          }
        }
        else {
          uVar13 = uVar22 + 3;
          if (uVar22 + 3 < uVar20) {
            do {
              uVar22 = uVar13;
              bVar30 = *(byte *)(lVar24 + -3 + uVar22);
              bVar32 = *(byte *)(lVar24 + -2 + uVar22);
              bVar31 = puVar34[uVar22 - 3];
              bVar26 = puVar34[uVar22 - 2];
              bVar10 = puVar34[uVar22 + lVar11 + -3];
              uVar27 = (uint)bVar31 - (uint)bVar10;
              uVar19 = -uVar27;
              if (0 < (int)uVar27) {
                uVar19 = uVar27;
              }
              uVar19 = uVar19 & 0xff;
              uVar28 = (uint)bVar30 - (uint)bVar10;
              uVar27 = -uVar28;
              if (0 < (int)uVar28) {
                uVar27 = uVar28;
              }
              uVar29 = (uint)bVar31 + (uint)bVar30 + (uint)bVar10 * -2;
              uVar28 = -uVar29;
              if (0 < (int)uVar29) {
                uVar28 = uVar29;
              }
              if ((uVar27 & 0xff) < uVar19) {
                uVar19 = uVar27 & 0xff;
                bVar30 = bVar31;
              }
              bVar31 = puVar34[uVar22 + lVar11 + -2];
              if (uVar28 < uVar19) {
                bVar30 = bVar10;
              }
              uVar27 = (uint)bVar26 - (uint)bVar31;
              uVar19 = -uVar27;
              if (0 < (int)uVar27) {
                uVar19 = uVar27;
              }
              bVar10 = *(byte *)(lVar24 + -1 + uVar22);
              uVar19 = uVar19 & 0xff;
              uVar28 = (uint)bVar32 - (uint)bVar31;
              uVar27 = -uVar28;
              if (0 < (int)uVar28) {
                uVar27 = uVar28;
              }
              uVar27 = uVar27 & 0xff;
              uVar29 = (uint)bVar26 + (uint)bVar32 + (uint)bVar31 * -2;
              uVar28 = -uVar29;
              if (0 < (int)uVar29) {
                uVar28 = uVar29;
              }
              bVar14 = *(byte *)(lVar24 + uVar22);
              uVar29 = uVar27;
              if (uVar19 <= uVar27) {
                uVar29 = uVar19;
              }
              bVar2 = puVar34[uVar22 - 1];
              if (uVar19 > uVar27) {
                bVar32 = bVar26;
              }
              if (uVar28 < uVar29) {
                bVar32 = bVar31;
              }
              uVar3 = puVar23[uVar22 - 2];
              bVar31 = puVar34[uVar22 + lVar11 + -1];
              uVar27 = (uint)bVar2 - (uint)bVar31;
              uVar19 = -uVar27;
              if (0 < (int)uVar27) {
                uVar19 = uVar27;
              }
              uVar19 = uVar19 & 0xff;
              uVar28 = (uint)bVar10 - (uint)bVar31;
              uVar27 = -uVar28;
              if (0 < (int)uVar28) {
                uVar27 = uVar28;
              }
              uVar29 = (uint)bVar10 + (uint)bVar2 + (uint)bVar31 * -2;
              uVar28 = -uVar29;
              if (0 < (int)uVar29) {
                uVar28 = uVar29;
              }
              bVar26 = puVar34[uVar22];
              if ((uVar27 & 0xff) < uVar19) {
                bVar10 = bVar2;
                uVar19 = uVar27 & 0xff;
              }
              bVar2 = puVar34[uVar22 + lVar11];
              if (uVar28 < uVar19) {
                bVar10 = bVar31;
              }
              uVar4 = puVar23[uVar22 - 1];
              uVar27 = (uint)bVar26 - (uint)bVar2;
              uVar19 = -uVar27;
              if (0 < (int)uVar27) {
                uVar19 = uVar27;
              }
              uVar19 = uVar19 & 0xff;
              uVar28 = (uint)bVar14 - (uint)bVar2;
              uVar27 = -uVar28;
              if (0 < (int)uVar28) {
                uVar27 = uVar28;
              }
              uVar29 = (uint)bVar26 + (uint)bVar14 + (uint)bVar2 * -2;
              uVar28 = -uVar29;
              if (0 < (int)uVar29) {
                uVar28 = uVar29;
              }
              if ((uVar27 & 0xff) < uVar19) {
                bVar14 = bVar26;
                uVar19 = uVar27 & 0xff;
              }
              if (uVar28 < uVar19) {
                bVar14 = bVar2;
              }
              uVar5 = puVar23[uVar22];
              puVar17[uVar22 - 3] = bVar30 + puVar23[uVar22 - 3];
              puVar17[uVar22 - 2] = bVar32 + uVar3;
              puVar17[uVar22 - 1] = bVar10 + uVar4;
              puVar17[uVar22] = bVar14 + uVar5;
              uVar13 = uVar22 + 4;
            } while (uVar22 + 4 < uVar20);
LAB_0011a3a9:
            uVar22 = uVar22 + 1;
          }
        }
        uVar19 = 0;
        bVar9 = true;
        if (uVar22 != uVar20) {
          do {
            bVar30 = puVar34[uVar22];
            bVar32 = puVar34[uVar22 + lVar11];
            uVar27 = (uint)bVar30 - (uint)bVar32;
            uVar19 = -uVar27;
            if (0 < (int)uVar27) {
              uVar19 = uVar27;
            }
            bVar31 = *(byte *)(lVar24 + uVar22);
            uVar19 = uVar19 & 0xff;
            uVar28 = (uint)bVar31 - (uint)bVar32;
            uVar27 = -uVar28;
            if (0 < (int)uVar28) {
              uVar27 = uVar28;
            }
            uVar29 = (uint)bVar30 + (uint)bVar31 + (uint)bVar32 * -2;
            uVar28 = -uVar29;
            if (0 < (int)uVar29) {
              uVar28 = uVar29;
            }
            if ((uVar27 & 0xff) < uVar19) {
              bVar31 = bVar30;
              uVar19 = uVar27 & 0xff;
            }
            if (uVar28 < uVar19) {
              bVar31 = bVar32;
            }
            puVar17[uVar22] = bVar31 + puVar23[uVar22];
            uVar22 = uVar22 + 1;
          } while (uVar20 != uVar22);
          uVar19 = 0;
        }
      }
      break;
    default:
      bVar9 = false;
      uVar19 = 0x24;
    }
    if (!bVar9) {
      return uVar19;
    }
    puVar34 = out + uVar16 * uVar20;
    uVar16 = uVar16 + 1;
    puVar17 = puVar17 + uVar20;
    puVar23 = puVar23 + lVar1;
    lVar24 = lVar24 + uVar20;
    local_b8 = local_b8 + uVar20;
    local_a8 = local_a8 + lVar1;
    if (uVar16 == h) {
      return 0;
    }
  } while( true );
}

Assistant:

static unsigned unfilter(unsigned char* out, const unsigned char* in, unsigned w, unsigned h, unsigned bpp) {
  /*
  For PNG filter method 0
  this function unfilters a single image (e.g. without interlacing this is called once, with Adam7 seven times)
  out must have enough bytes allocated already, in must have the scanlines + 1 filtertype byte per scanline
  w and h are image dimensions or dimensions of reduced image, bpp is bits per pixel
  in and out are allowed to be the same memory address (but aren't the same size since in has the extra filter bytes)
  */

  unsigned y;
  unsigned char* prevline = 0;

  /*bytewidth is used for filtering, is 1 when bpp < 8, number of bytes per pixel otherwise*/
  size_t bytewidth = (bpp + 7u) / 8u;
  size_t linebytes = (w * bpp + 7u) / 8u;

  for(y = 0; y < h; ++y) {
    size_t outindex = linebytes * y;
    size_t inindex = (1 + linebytes) * y; /*the extra filterbyte added to each row*/
    unsigned char filterType = in[inindex];

    CERROR_TRY_RETURN(unfilterScanline(&out[outindex], &in[inindex + 1], prevline, bytewidth, filterType, linebytes));

    prevline = &out[outindex];
  }

  return 0;
}